

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastBooleanAndObjectEqLikely
          (Lowerer *this,Instr *instr,Opnd *src1,Opnd *src2,LabelInstr *labelHelper,
          LabelInstr *labelEqualLikely,bool *pNeedHelper,bool isInHelper)

{
  Opnd *pOVar1;
  bool bVar2;
  short sVar3;
  JITTimeFunctionBody *this_00;
  BranchInstr *pBVar4;
  RegOpnd *pRVar5;
  bool local_c1;
  bool local_a1;
  byte local_74;
  bool local_73;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_64;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_62;
  BranchInstr *local_60;
  BranchInstr *branchToHelper;
  LabelInstr *labelTypeIdCheck;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  byte local_43;
  byte local_42;
  byte local_41;
  bool isStrictMode;
  bool isStrictCompare;
  LabelInstr *pLStack_40;
  bool isInHelper_local;
  LabelInstr *labelEqualLikely_local;
  LabelInstr *labelHelper_local;
  Opnd *src2_local;
  Opnd *src1_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  local_41 = isInHelper;
  *pNeedHelper = true;
  if ((src1 == (Opnd *)0x0) || (src2 == (Opnd *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    local_42 = 0;
    pLStack_40 = labelEqualLikely;
    labelEqualLikely_local = labelHelper;
    labelHelper_local = (LabelInstr *)src2;
    src2_local = src1;
    src1_local = (Opnd *)instr;
    instr_local = (Instr *)this;
    this_00 = Func::GetJITFunctionBody(this->m_func);
    local_43 = JITTimeFunctionBody::IsStrictMode(this_00);
    sVar3 = (short)*(undefined4 *)&src1_local[3]._vptr_Opnd;
    if ((((ushort)(sVar3 - 0x14U) < 2) || ((ushort)(sVar3 - 0x41U) < 2)) ||
       (sVar3 == 0x196 || sVar3 == 0x197)) {
      local_42 = 1;
    }
    local_46.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(src2_local);
    bVar2 = ValueType::IsLikelyBoolean((ValueType *)&local_46.field_0);
    local_73 = false;
    if (bVar2) {
      local_48.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType((Opnd *)labelHelper_local);
      local_73 = ValueType::IsLikelyBoolean((ValueType *)&local_48.field_0);
    }
    if (local_73 == false) {
      labelTypeIdCheck._2_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(src2_local);
      bVar2 = ValueType::HasBeenObject((ValueType *)((long)&labelTypeIdCheck + 2));
      local_a1 = false;
      if (bVar2) {
        labelTypeIdCheck._0_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType((Opnd *)labelHelper_local);
        local_a1 = ValueType::HasBeenObject((ValueType *)&labelTypeIdCheck);
      }
      if (local_a1 == false) {
        local_62.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(src2_local);
        bVar2 = ValueType::IsLikelySymbol((ValueType *)&local_62.field_0);
        local_c1 = false;
        if (bVar2) {
          local_64.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType((Opnd *)labelHelper_local);
          local_c1 = ValueType::IsLikelySymbol((ValueType *)&local_64.field_0);
        }
        if (local_c1 == false) {
          return false;
        }
        pRVar5 = IR::Opnd::AsRegOpnd(src2_local);
        GenerateSymbolTest(this,pRVar5,(Instr *)src1_local,labelEqualLikely_local,(LabelInstr *)0x0,
                           true);
        pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)labelHelper_local);
        GenerateSymbolTest(this,pRVar5,(Instr *)src1_local,labelEqualLikely_local,(LabelInstr *)0x0,
                           true);
      }
      else {
        branchToHelper = (BranchInstr *)IR::LabelInstr::New(Label,this->m_func,(bool)(local_41 & 1))
        ;
        if ((local_42 & 1) == 0) {
          pRVar5 = IR::Opnd::AsRegOpnd(src2_local);
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,&pRVar5->super_Opnd,(Instr *)src1_local,
                     labelEqualLikely_local,false);
          pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)labelHelper_local);
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,&pRVar5->super_Opnd,(Instr *)src1_local,
                     labelEqualLikely_local,false);
          pRVar5 = IR::Opnd::AsRegOpnd(src2_local);
          GenerateIsDynamicObject
                    (this,pRVar5,(Instr *)src1_local,(LabelInstr *)branchToHelper,false);
        }
        else {
          pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)labelHelper_local);
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,&pRVar5->super_Opnd,(Instr *)src1_local,
                     labelEqualLikely_local,false);
        }
        pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)labelHelper_local);
        GenerateIsDynamicObject(this,pRVar5,(Instr *)src1_local,pLStack_40,true);
        IR::Instr::InsertBefore((Instr *)src1_local,&branchToHelper->super_Instr);
        if ((local_43 & 1) == 0) {
          bVar2 = ExternalLowerer::TryGenerateFastExternalEqTest
                            (src2_local,(Opnd *)labelHelper_local,(Instr *)src1_local,
                             labelEqualLikely_local,pLStack_40,this,(bool)(local_42 & 1),
                             (bool)(local_41 & 1));
          if (!bVar2) {
            if ((local_42 & 1) == 0) {
              pRVar5 = IR::Opnd::AsRegOpnd(src2_local);
              GenerateIsBuiltinRecyclableObject
                        (this,pRVar5,(Instr *)src1_local,labelEqualLikely_local,false,
                         (LabelInstr *)0x0,(bool)(local_41 & 1));
            }
            pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)labelHelper_local);
            GenerateIsBuiltinRecyclableObject
                      (this,pRVar5,(Instr *)src1_local,labelEqualLikely_local,false,
                       (LabelInstr *)0x0,(bool)(local_41 & 1));
          }
        }
        else {
          *(byte *)&branchToHelper[1].super_Instr._vptr_Instr =
               *(byte *)&branchToHelper[1].super_Instr._vptr_Instr & 0xfd | 2;
          local_60 = IR::BranchInstr::New(JMP,labelEqualLikely_local,this->m_func);
          IR::Instr::InsertBefore((Instr *)src1_local,&local_60->super_Instr);
        }
      }
    }
    else if ((local_42 & 1) == 0) {
      pRVar5 = IR::Opnd::AsRegOpnd(src2_local);
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&pRVar5->super_Opnd,(Instr *)src1_local,labelEqualLikely_local,
                 false);
      pRVar5 = IR::Opnd::AsRegOpnd(src2_local);
      GenerateJSBooleanTest(this,pRVar5,(Instr *)src1_local,labelEqualLikely_local,false);
      pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)labelHelper_local);
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&pRVar5->super_Opnd,(Instr *)src1_local,labelEqualLikely_local,
                 false);
      pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)labelHelper_local);
      bVar2 = GenerateJSBooleanTest(this,pRVar5,(Instr *)src1_local,pLStack_40,true);
      pOVar1 = src1_local;
      if (bVar2) {
        pBVar4 = IR::BranchInstr::New(JMP,labelEqualLikely_local,this->m_func);
        IR::Instr::InsertBefore((Instr *)pOVar1,&pBVar4->super_Instr);
      }
    }
    else {
      labelTypeIdCheck._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(src2_local);
      bVar2 = ValueType::IsBoolean((ValueType *)((long)&labelTypeIdCheck + 6));
      local_74 = 0;
      if (!bVar2) {
        labelTypeIdCheck._4_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType((Opnd *)labelHelper_local);
        bVar2 = ValueType::IsBoolean((ValueType *)((long)&labelTypeIdCheck + 4));
        local_74 = bVar2 ^ 0xff;
      }
      if ((local_74 & 1) == 0) {
        *pNeedHelper = false;
      }
      else {
        pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)labelHelper_local);
        LowererMD::GenerateObjectTest
                  (&this->m_lowererMD,&pRVar5->super_Opnd,(Instr *)src1_local,labelEqualLikely_local
                   ,false);
        pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)labelHelper_local);
        bVar2 = GenerateJSBooleanTest(this,pRVar5,(Instr *)src1_local,pLStack_40,true);
        pOVar1 = src1_local;
        if (bVar2) {
          pBVar4 = IR::BranchInstr::New(JMP,labelEqualLikely_local,this->m_func);
          IR::Instr::InsertBefore((Instr *)pOVar1,&pBVar4->super_Instr);
        }
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Lowerer::GenerateFastBooleanAndObjectEqLikely(IR::Instr * instr, IR::Opnd *src1, IR::Opnd *src2, IR::LabelInstr * labelHelper, IR::LabelInstr * labelEqualLikely, bool *pNeedHelper, bool isInHelper)
{
    *pNeedHelper = true;

    if (!src1 || !src2)
    {
        return false;
    }

    bool isStrictCompare = false;
    bool isStrictMode = this->m_func->GetJITFunctionBody()->IsStrictMode();

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmSrNeq_A:
        isStrictCompare = true;
        break;
    }

    if (src1->GetValueType().IsLikelyBoolean() && src2->GetValueType().IsLikelyBoolean())
    {
        //
        // Booleans
        //
        if (isStrictCompare)
        {
            if (!src1->GetValueType().IsBoolean() && !src2->GetValueType().IsBoolean())
            {
                this->m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper, false);
                if (GenerateJSBooleanTest(src2->AsRegOpnd(), instr, labelEqualLikely, true))
                {
                    instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func));
                }
            }
            else
            {
                *pNeedHelper = false;
            }
        }
        else
        {
            this->m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper, false);
            GenerateJSBooleanTest(src1->AsRegOpnd(), instr, labelHelper, false);
            this->m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper, false);
            if (GenerateJSBooleanTest(src2->AsRegOpnd(), instr, labelEqualLikely, true))
            {
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func));
            }
        }
    }
    else if (src1->GetValueType().HasBeenObject() && src2->GetValueType().HasBeenObject())
    {
        //
        // Objects
        //
        IR::LabelInstr *labelTypeIdCheck = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);

        if (!isStrictCompare)
        {
            // If not strictBr, verify both sides are dynamic objects
            this->m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper, false);
            this->m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper, false);
            GenerateIsDynamicObject(src1->AsRegOpnd(), instr, labelTypeIdCheck, false);
        }
        else
        {
            this->m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper, false);
        }
        GenerateIsDynamicObject(src2->AsRegOpnd(), instr, labelEqualLikely, true);

        instr->InsertBefore(labelTypeIdCheck);

        if (isStrictMode)
        {
            labelTypeIdCheck->isOpHelper = true;
            IR::BranchInstr *branchToHelper = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func);
            instr->InsertBefore(branchToHelper);
        }
        else
        {
            if (!ExternalLowerer::TryGenerateFastExternalEqTest(src1, src2, instr, labelHelper, labelEqualLikely, this, isStrictCompare, isInHelper))
            {
                if (!isStrictCompare)
                {
                    GenerateIsBuiltinRecyclableObject(src1->AsRegOpnd(), instr, labelHelper, false /*checkObjectAndDynamicObject*/, nullptr /*labelContinue*/, isInHelper);
                }
                GenerateIsBuiltinRecyclableObject(src2->AsRegOpnd(), instr, labelHelper, false /*checkObjectAndDynamicObject*/, nullptr /*labelContinue*/, isInHelper);
            }
        }
    }
    else if (src1->GetValueType().IsLikelySymbol() && src2->GetValueType().IsLikelySymbol())
    {
        this->GenerateSymbolTest(src1->AsRegOpnd(), instr, labelHelper, nullptr, true);
        this->GenerateSymbolTest(src2->AsRegOpnd(), instr, labelHelper, nullptr, true);
    }
    else
    {
        return false;
    }

    return true;
}